

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

vector<CScript,_std::allocator<CScript>_> * __thiscall
anon_unknown.dwarf_1f0a16::ComboDescriptor::MakeScripts
          (ComboDescriptor *this,vector<CPubKey,_std::allocator<CPubKey>_> *keys,
          Span<const_CScript> param_3,FlatSigningProvider *out)

{
  bool bVar1;
  _Rb_tree_iterator<std::pair<const_CScriptID,_CScript>_> this_00;
  undefined1 uVar2;
  vector<CScript,_std::allocator<CScript>_> *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_CKeyID,_CPubKey>_>,_bool> pVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_CScriptID,_CScript>_>,_bool> pVar4;
  vector<CScript,_std::allocator<CScript>_> *ret;
  CScript p2wpkh;
  CKeyID id;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *in_stack_fffffffffffffd48;
  ScriptHash *in_stack_fffffffffffffd50;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *in_stack_fffffffffffffd58;
  undefined7 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd67;
  map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  *in_stack_fffffffffffffd68;
  CPubKey *in_stack_fffffffffffffd70;
  undefined7 in_stack_fffffffffffffd90;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_1d0 [5];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CScript,_std::allocator<CScript>_>::vector
            ((vector<CScript,_std::allocator<CScript>_> *)in_stack_fffffffffffffd48);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::operator[]
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_fffffffffffffd58,
             (size_type)in_stack_fffffffffffffd50);
  CPubKey::GetID(in_stack_fffffffffffffd70);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::operator[]
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_fffffffffffffd58,
             (size_type)in_stack_fffffffffffffd50);
  pVar3 = std::map<CKeyID,CPubKey,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
          ::emplace<CKeyID&,CPubKey_const&>
                    ((map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                      *)in_stack_fffffffffffffd68,
                     (CKeyID *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                     (CPubKey *)in_stack_fffffffffffffd58);
  uVar2 = pVar3.second;
  std::vector<CPubKey,_std::allocator<CPubKey>_>::operator[]
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_fffffffffffffd58,
             (size_type)in_stack_fffffffffffffd50);
  GetScriptForRawPubKey((CPubKey *)CONCAT17(uVar2,in_stack_fffffffffffffd90));
  std::vector<CScript,_std::allocator<CScript>_>::emplace_back<CScript>
            ((vector<CScript,_std::allocator<CScript>_> *)in_stack_fffffffffffffd68,
             (CScript *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
  CScript::~CScript((CScript *)in_stack_fffffffffffffd48);
  PKHash::PKHash((PKHash *)in_stack_fffffffffffffd48,(CKeyID *)0x21ae79);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<PKHash,void,void,PKHash,void>
            (in_stack_fffffffffffffd58,(PKHash *)in_stack_fffffffffffffd50);
  GetScriptForDestination(in_stack_fffffffffffffd48);
  std::vector<CScript,_std::allocator<CScript>_>::emplace_back<CScript>
            ((vector<CScript,_std::allocator<CScript>_> *)in_stack_fffffffffffffd68,
             (CScript *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
  CScript::~CScript((CScript *)in_stack_fffffffffffffd48);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant(in_stack_fffffffffffffd48);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::operator[]
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_fffffffffffffd58,
             (size_type)in_stack_fffffffffffffd50);
  bVar1 = CPubKey::IsCompressed((CPubKey *)in_stack_fffffffffffffd48);
  if (bVar1) {
    WitnessV0KeyHash::WitnessV0KeyHash
              ((WitnessV0KeyHash *)in_stack_fffffffffffffd48,(uint160 *)0x21af0e);
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::variant<WitnessV0KeyHash,void,void,WitnessV0KeyHash,void>
              (in_stack_fffffffffffffd58,(WitnessV0KeyHash *)in_stack_fffffffffffffd50);
    GetScriptForDestination(in_stack_fffffffffffffd48);
    std::
    variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~variant(in_stack_fffffffffffffd48);
    CScriptID::CScriptID
              ((CScriptID *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
               (CScript *)in_stack_fffffffffffffd58);
    pVar4 = std::
            map<CScriptID,CScript,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
            ::emplace<CScriptID,CScript&>
                      (in_stack_fffffffffffffd68,
                       (CScriptID *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                       (CScript *)in_stack_fffffffffffffd58);
    this_00 = pVar4.first._M_node;
    uVar2 = pVar4.second;
    std::vector<CScript,std::allocator<CScript>>::emplace_back<CScript&>
              ((vector<CScript,_std::allocator<CScript>_> *)this_00._M_node,
               (CScript *)CONCAT17(uVar2,in_stack_fffffffffffffd60));
    ScriptHash::ScriptHash
              ((ScriptHash *)CONCAT17(uVar2,in_stack_fffffffffffffd60),
               (CScript *)in_stack_fffffffffffffd58);
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::variant<ScriptHash,void,void,ScriptHash,void>(local_1d0,in_stack_fffffffffffffd50);
    GetScriptForDestination(in_stack_fffffffffffffd48);
    std::vector<CScript,_std::allocator<CScript>_>::emplace_back<CScript>
              ((vector<CScript,_std::allocator<CScript>_> *)this_00._M_node,
               (CScript *)CONCAT17(uVar2,in_stack_fffffffffffffd60));
    CScript::~CScript((CScript *)in_stack_fffffffffffffd48);
    std::
    variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~variant(in_stack_fffffffffffffd48);
    CScript::~CScript((CScript *)in_stack_fffffffffffffd48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CScript> MakeScripts(const std::vector<CPubKey>& keys, Span<const CScript>, FlatSigningProvider& out) const override
    {
        std::vector<CScript> ret;
        CKeyID id = keys[0].GetID();
        out.pubkeys.emplace(id, keys[0]);
        ret.emplace_back(GetScriptForRawPubKey(keys[0])); // P2PK
        ret.emplace_back(GetScriptForDestination(PKHash(id))); // P2PKH
        if (keys[0].IsCompressed()) {
            CScript p2wpkh = GetScriptForDestination(WitnessV0KeyHash(id));
            out.scripts.emplace(CScriptID(p2wpkh), p2wpkh);
            ret.emplace_back(p2wpkh);
            ret.emplace_back(GetScriptForDestination(ScriptHash(p2wpkh))); // P2SH-P2WPKH
        }
        return ret;
    }